

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::invalidateSubFramebuffer
          (ReferenceContext *this,deUint32 target,int numAttachments,deUint32 *attachments,int x,
          int y,int width,int height)

{
  MultisampleConstPixelBufferAccess *this_00;
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  int width_00;
  int iVar4;
  int ndx;
  long lVar5;
  deUint32 dVar6;
  MultisamplePixelBufferAccess *color;
  deUint32 dVar7;
  deUint32 dVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  Vec4 colorClearValue;
  MultisamplePixelBufferAccess access;
  MultisamplePixelBufferAccess buf;
  char local_e3 [3];
  int local_e0;
  int local_dc;
  ReferenceContext *local_d8;
  int local_d0;
  int local_cc;
  undefined1 local_c8 [32];
  int local_a8;
  int local_a4;
  int local_a0;
  MultisamplePixelBufferAccess local_88;
  MultisamplePixelBufferAccess local_58;
  
  if (target == 0x8d40) {
    if (((numAttachments < 0) || (attachments == (deUint32 *)0x0 && 1 < (uint)numAttachments)) ||
       ((height | width) < 0)) {
      if (this->m_lastError == 0) {
        this->m_lastError = 0x501;
      }
    }
    else {
      local_c8._0_4_ = R;
      local_c8._4_4_ = SNORM_INT8;
      local_c8._8_4_ = 0;
      local_c8._12_4_ = 0;
      local_e3[1] = '\0';
      local_e3[2] = '\0';
      if (numAttachments == 0) {
        local_e3[0] = '\0';
      }
      else {
        bVar10 = this->m_drawFramebufferBinding != (Framebuffer *)0x0;
        dVar6 = 0x1800;
        if (bVar10) {
          dVar6 = 0x8ce0;
        }
        dVar7 = 0x1801;
        if (bVar10) {
          dVar7 = 0x8d00;
        }
        dVar8 = 0x1802;
        if (bVar10) {
          dVar8 = 0x8d20;
        }
        uVar9 = 0;
        local_e3[2] = 0;
        local_e3[1] = 0;
        local_e3[0] = '\0';
        do {
          bVar10 = this->m_drawFramebufferBinding == (Framebuffer *)0x0;
          dVar1 = attachments[uVar9];
          bVar11 = dVar1 != 0x821a;
          if (((dVar1 != dVar6) && (dVar1 != dVar7)) && (dVar1 != dVar8 && (bVar11 || bVar10))) {
            if (this->m_lastError != 0) {
              return;
            }
            this->m_lastError = 0x501;
            return;
          }
          if (dVar1 == dVar6) {
            local_e3[0] = '\x01';
          }
          if (!bVar11 && !bVar10) {
            local_e3[1] = 1;
          }
          if (dVar1 == dVar7) {
            local_e3[1] = 1;
          }
          if (dVar1 == dVar8 || !bVar11 && !bVar10) {
            local_e3[2] = 1;
          }
          uVar9 = uVar9 + 1;
        } while ((uint)numAttachments != uVar9);
        local_d8 = this;
        local_d0 = x;
        local_cc = y;
      }
      iVar4 = 0;
      if (0 < x) {
        iVar4 = x;
      }
      local_d8 = (ReferenceContext *)CONCAT44(local_d8._4_4_,iVar4);
      iVar4 = 0;
      if (0 < y) {
        iVar4 = y;
      }
      local_e0 = width + x;
      local_dc = height + y;
      this_00 = (MultisampleConstPixelBufferAccess *)(local_c8 + 0x18);
      lVar5 = 0;
      do {
        if (local_e3[lVar5] == '\x01') {
          if (lVar5 == 0) {
            getDrawColorbuffer(&local_58,this);
          }
          else {
            if (lVar5 != 1) {
              getDrawStencilbuffer(&local_88,this);
            }
            else {
              getDrawDepthbuffer(&local_88,this);
            }
            tcu::getEffectiveDepthStencilAccess
                      ((PixelBufferAccess *)this_00,&local_88.m_access,(uint)(lVar5 != 1));
            rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)this_00);
          }
          rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                    (this_00,&local_58);
          if (((local_a8 != 0) && (local_a4 != 0)) && (local_a0 != 0)) {
            iVar2 = local_58.m_access.super_ConstPixelBufferAccess.m_size.m_data[1];
            if (local_e0 <= local_58.m_access.super_ConstPixelBufferAccess.m_size.m_data[1]) {
              iVar2 = local_e0;
            }
            iVar3 = local_58.m_access.super_ConstPixelBufferAccess.m_size.m_data[2];
            if (local_dc <= local_58.m_access.super_ConstPixelBufferAccess.m_size.m_data[2]) {
              iVar3 = local_dc;
            }
            width_00 = iVar2 - (int)local_d8;
            if (iVar2 - (int)local_d8 < 1) {
              width_00 = 0;
            }
            iVar2 = iVar3 - iVar4;
            if (iVar3 - iVar4 < 1) {
              iVar2 = 0;
            }
            rr::getSubregion((MultisamplePixelBufferAccess *)this_00,&local_58,(int)local_d8,iVar4,
                             width_00,iVar2);
            if (lVar5 == 0) {
              color = (MultisamplePixelBufferAccess *)local_c8;
            }
            else {
              if (lVar5 != 1) {
                local_88.m_access.super_ConstPixelBufferAccess.m_format.order = R;
                local_88.m_access.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
                local_88.m_access.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
                local_88.m_access.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
                rr::clear((MultisamplePixelBufferAccess *)this_00,(IVec4 *)&local_88);
                goto LAB_00819a02;
              }
              local_88.m_access.super_ConstPixelBufferAccess.m_format.order = 0x3f800000;
              local_88.m_access.super_ConstPixelBufferAccess.m_format.type = 0x3f800000;
              local_88.m_access.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f800000;
              local_88.m_access.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f800000;
              color = &local_88;
            }
            rr::clear((MultisamplePixelBufferAccess *)this_00,(Vec4 *)color);
          }
        }
LAB_00819a02:
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
    }
  }
  else if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::invalidateSubFramebuffer (deUint32 target, int numAttachments, const deUint32* attachments, int x, int y, int width, int height)
{
	RC_IF_ERROR(target != GL_FRAMEBUFFER, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR((numAttachments < 0) || (numAttachments > 1 && attachments == DE_NULL), GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || height < 0, GL_INVALID_VALUE, RC_RET_VOID);

	// \todo [2012-07-17 pyry] Support multiple color attachments.

	const Vec4		colorClearValue		(0.0f);
	const float		depthClearValue		= 1.0f;
	const int		stencilClearValue	= 0;

	bool			isFboBound			= m_drawFramebufferBinding != DE_NULL;
	bool			discardBuffers[3]	= { false, false, false }; // Color, depth, stencil

	for (int attNdx = 0; attNdx < numAttachments; attNdx++)
	{
		bool	isColor			= attachments[attNdx] == (isFboBound ? GL_COLOR_ATTACHMENT0		: GL_COLOR);
		bool	isDepth			= attachments[attNdx] == (isFboBound ? GL_DEPTH_ATTACHMENT		: GL_DEPTH);
		bool	isStencil		= attachments[attNdx] == (isFboBound ? GL_STENCIL_ATTACHMENT	: GL_STENCIL);
		bool	isDepthStencil	= isFboBound && attachments[attNdx] == GL_DEPTH_STENCIL_ATTACHMENT;

		RC_IF_ERROR(!isColor && !isDepth && !isStencil && !isDepthStencil, GL_INVALID_VALUE, RC_RET_VOID);

		if (isColor)						discardBuffers[0] = true;
		if (isDepth || isDepthStencil)		discardBuffers[1] = true;
		if (isStencil || isDepthStencil)	discardBuffers[2] = true;
	}

	for (int ndx = 0; ndx < 3; ndx++)
	{
		if (!discardBuffers[ndx])
			continue;

		bool								isColor					= ndx == 0;
		bool								isDepth					= ndx == 1;
		bool								isStencil				= ndx == 2;
		rr::MultisamplePixelBufferAccess	buf						= isColor ? getDrawColorbuffer()								:
																	  isDepth ? getDepthMultisampleAccess(getDrawDepthbuffer())		:
																				getStencilMultisampleAccess(getDrawStencilbuffer());

		if (isEmpty(buf))
			continue;

		tcu::IVec4							area					= intersect(tcu::IVec4(0, 0, buf.raw().getHeight(), buf.raw().getDepth()), tcu::IVec4(x, y, width, height));
		rr::MultisamplePixelBufferAccess	access					= rr::getSubregion(buf, area.x(), area.y(), area.z(), area.w());

		if (isColor)
			rr::clear(access, colorClearValue);
		else if (isDepth)
			rr::clear(access, tcu::Vec4(depthClearValue));
		else if (isStencil)
			rr::clear(access, tcu::IVec4(stencilClearValue));
	}
}